

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O1

void __thiscall
webrtc::LappedTransform::LappedTransform
          (LappedTransform *this,size_t num_in_channels,size_t num_out_channels,size_t chunk_length,
          float *window,size_t block_length,size_t shift_amount,Callback *callback)

{
  size_t *v1;
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  string *psVar4;
  ostream *poVar5;
  uint local_1b4;
  Blocker *local_1b0;
  FatalMessage local_1a8;
  
  (this->blocker_callback_).super_BlockerCallback._vptr_BlockerCallback =
       (_func_int **)&PTR__BlockerCallback_001cfb20;
  (this->blocker_callback_).parent_ = this;
  this->num_in_channels_ = num_in_channels;
  this->num_out_channels_ = num_out_channels;
  this->block_length_ = block_length;
  this->chunk_length_ = chunk_length;
  this->block_processor_ = callback;
  local_1b0 = &this->blocker_;
  Blocker::Blocker(local_1b0,chunk_length,block_length,num_in_channels,num_out_channels,window,
                   shift_amount,(BlockerCallback *)this);
  iVar2 = RealFourier::FftOrder(0x144c45);
  RealFourier::Create((RealFourier *)&local_1a8,iVar2);
  uVar1 = local_1a8._0_8_;
  local_1a8._0_8_ = (RealFourier *)0x0;
  (this->fft_)._M_t.
  super___uniq_ptr_impl<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::RealFourier_*,_std::default_delete<webrtc::RealFourier>_>.
  super__Head_base<0UL,_webrtc::RealFourier_*,_false>._M_head_impl = (RealFourier *)uVar1;
  iVar2 = (*(*(_func_int ***)uVar1)[4])();
  sVar3 = RealFourier::ComplexLength(iVar2);
  this->cplx_length_ = sVar3;
  AlignedArray<float>::AlignedArray(&this->real_buf_,num_in_channels,this->block_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_pre_,num_in_channels,this->cplx_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_post_,num_out_channels,this->cplx_length_,0x20);
  if ((this->num_in_channels_ == 0) || (this->num_out_channels_ == 0)) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Check failed: num_in_channels_ > 0 && num_out_channels_ > 0",
               0x3b);
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&local_1a8);
    std::operator<<(poVar5,"# ");
  }
  else {
    v1 = &this->block_length_;
    local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
    if (*v1 == 0) {
      psVar4 = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                         (v1,(uint *)&local_1a8,"block_length_ > 0u");
    }
    else {
      psVar4 = (string *)0x0;
    }
    if (psVar4 == (string *)0x0) {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
      if (this->chunk_length_ == 0) {
        psVar4 = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                           (&this->chunk_length_,(uint *)&local_1a8,"chunk_length_ > 0u");
      }
      else {
        psVar4 = (string *)0x0;
      }
      if (psVar4 == (string *)0x0) {
        if (this->block_processor_ == (Callback *)0x0) {
          rtc::FatalMessage::FatalMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                     ,0x5a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Check failed: block_processor_",0x1e);
          std::ios::widen((char)(ostream *)&local_1a8 +
                          (char)((RealFourier *)(local_1a8._0_8_ + 0xffffffffffffffe8))->
                                _vptr_RealFourier);
          std::ostream::put((char)(_Head_base<0UL,_webrtc::RealFourier_*,_false> *)&local_1a8);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# ",2);
        }
        else {
          local_1b4 = 0;
          local_1a8._0_8_ = *v1 - 1 & *v1;
          if ((RealFourier *)local_1a8._0_8_ == (RealFourier *)0x0) {
            psVar4 = (string *)0x0;
          }
          else {
            psVar4 = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                               (&local_1b4,(unsigned_long *)&local_1a8,
                                "0u == block_length_ & (block_length_ - 1)");
          }
          if (psVar4 == (string *)0x0) {
            return;
          }
          rtc::FatalMessage::FatalMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                     ,0x5d,psVar4);
        }
      }
      else {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                   ,0x59,psVar4);
      }
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                 ,0x58,psVar4);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

LappedTransform::LappedTransform(size_t num_in_channels,
                                 size_t num_out_channels,
                                 size_t chunk_length,
                                 const float* window,
                                 size_t block_length,
                                 size_t shift_amount,
                                 Callback* callback)
    : blocker_callback_(this),
      num_in_channels_(num_in_channels),
      num_out_channels_(num_out_channels),
      block_length_(block_length),
      chunk_length_(chunk_length),
      block_processor_(callback),
      blocker_(chunk_length_,
               block_length_,
               num_in_channels_,
               num_out_channels_,
               window,
               shift_amount,
               &blocker_callback_),
      fft_(rtc::ScopedToUnique(
          RealFourier::Create(RealFourier::FftOrder(block_length_)))),
      cplx_length_(RealFourier::ComplexLength(fft_->order())),
      real_buf_(num_in_channels,
                block_length_,
                RealFourier::kFftBufferAlignment),
      cplx_pre_(num_in_channels,
                cplx_length_,
                RealFourier::kFftBufferAlignment),
      cplx_post_(num_out_channels,
                 cplx_length_,
                 RealFourier::kFftBufferAlignment) {
  RTC_CHECK(num_in_channels_ > 0 && num_out_channels_ > 0);
  RTC_CHECK_GT(block_length_, 0u);
  RTC_CHECK_GT(chunk_length_, 0u);
  RTC_CHECK(block_processor_);

  // block_length_ power of 2?
  RTC_CHECK_EQ(0u, block_length_ & (block_length_ - 1));
}